

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_file.cpp
# Opt level: O0

bool FindEitherActiveRuntimeFilename
               (char *prefix_desc,string *rt_dir_prefix,uint16_t major_version,string *out)

{
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *this;
  bool bVar1;
  string local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  undefined1 local_2a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> undecorated_path;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  undefined1 local_238 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> decorated_path;
  string local_200;
  allocator local_1d9;
  string local_1d8;
  ostringstream local_1a8 [8];
  ostringstream oss;
  string *out_local;
  uint16_t major_version_local;
  string *rt_dir_prefix_local;
  char *prefix_desc_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,
                  "Looking for active_runtime.x86_64.json or active_runtime.json in ");
  std::operator<<((ostream *)local_1a8,prefix_desc);
  std::operator<<((ostream *)local_1a8,": ");
  std::operator<<((ostream *)local_1a8,(string *)rt_dir_prefix);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d8,"",&local_1d9);
  std::__cxx11::ostringstream::str();
  decorated_path.field_2._8_8_ = 0;
  this = (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)
         ((long)&decorated_path.field_2 + 8);
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(this);
  LoaderLogger::LogInfoMessage(&local_1d8,&local_200,this);
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
            ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)
             ((long)&decorated_path.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::__cxx11::to_string(&local_278,(uint)major_version);
  std::operator+(&local_258,rt_dir_prefix,&local_278);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                 &local_258,"/active_runtime.x86_64.json");
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  undecorated_path.field_2._M_local_buf[0xc] = FileSysUtilsPathExists((string *)local_238);
  if ((bool)undecorated_path.field_2._M_local_buf[0xc]) {
    std::__cxx11::string::operator=((string *)out,(string *)local_238);
    prefix_desc_local._7_1_ = 1;
  }
  undecorated_path.field_2._13_3_ = 0;
  std::__cxx11::string::~string((string *)local_238);
  if (undecorated_path.field_2._12_4_ == 0) {
    std::__cxx11::to_string(&local_2e0,(uint)major_version);
    std::operator+(&local_2c0,rt_dir_prefix,&local_2e0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0,
                   &local_2c0,"/active_runtime.json");
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2e0);
    bVar1 = FileSysUtilsPathExists((string *)local_2a0);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)out,(string *)local_2a0);
      prefix_desc_local._7_1_ = 1;
    }
    undecorated_path.field_2._13_3_ = 0;
    undecorated_path.field_2._M_local_buf[0xc] = bVar1;
    std::__cxx11::string::~string((string *)local_2a0);
    if (undecorated_path.field_2._12_4_ == 0) {
      prefix_desc_local._7_1_ = 0;
    }
  }
  return (bool)(prefix_desc_local._7_1_ & 1);
}

Assistant:

static bool FindEitherActiveRuntimeFilename(const char *prefix_desc, const std::string &rt_dir_prefix, uint16_t major_version,
                                            std::string &out) {
    {
        std::ostringstream oss;
        oss << "Looking for active_runtime." XR_ARCH_ABI ".json or active_runtime.json in ";
        oss << prefix_desc;
        oss << ": ";
        oss << rt_dir_prefix;

        LoaderLogger::LogInfoMessage("", oss.str());
    }
    {
        auto decorated_path = rt_dir_prefix + std::to_string(major_version) + "/active_runtime." XR_ARCH_ABI ".json";

        if (FileSysUtilsPathExists(decorated_path)) {
            out = decorated_path;
            return true;
        }
    }
    {
        auto undecorated_path = rt_dir_prefix + std::to_string(major_version) + "/active_runtime.json";

        if (FileSysUtilsPathExists(undecorated_path)) {
            out = undecorated_path;
            return true;
        }
    }
    return false;
}